

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O3

void __thiscall Fl_X::set_icons(Fl_X *this)

{
  int count;
  icon_data *piVar1;
  unsigned_long *puVar2;
  unsigned_long **property;
  size_t *psVar3;
  size_t net_wm_icons_size;
  unsigned_long *net_wm_icons;
  
  psVar3 = &net_wm_icons_size;
  piVar1 = this->w->icon_;
  count = *(int *)(piVar1 + 0x10);
  if (count == 0) {
    property = &default_net_wm_icons;
    psVar3 = &default_net_wm_icons_size;
  }
  else {
    property = &net_wm_icons;
    icons_to_property(*(Fl_RGB_Image ***)(piVar1 + 8),count,property,&net_wm_icons_size);
  }
  puVar2 = *property;
  XChangeProperty(fl_display,this->xid,fl_NET_WM_ICON,6,0x20,0,puVar2,(int)*psVar3);
  if (puVar2 == (unsigned_long *)0x0 || *(int *)(this->w->icon_ + 0x10) == 0) {
    return;
  }
  operator_delete__(puVar2);
  return;
}

Assistant:

void Fl_X::set_icons() {
  unsigned long *net_wm_icons;
  size_t net_wm_icons_size;

  if (w->icon_->count) {
    icons_to_property((const Fl_RGB_Image **)w->icon_->icons, w->icon_->count,
                      &net_wm_icons, &net_wm_icons_size);
  } else {
    net_wm_icons = default_net_wm_icons;
    net_wm_icons_size = default_net_wm_icons_size;
  }

  XChangeProperty (fl_display, xid, fl_NET_WM_ICON, XA_CARDINAL, 32,
      PropModeReplace, (unsigned char*) net_wm_icons, net_wm_icons_size);

  if (w->icon_->count) {
    delete [] net_wm_icons;
    net_wm_icons = 0L;
    net_wm_icons_size = 0;
  }
}